

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall chatra::RuntimeImp::removeBreakPoint(RuntimeImp *this,BreakPointId breakPointId)

{
  iterator __it;
  undefined8 *puVar1;
  BreakPointId local_30;
  BreakPointId breakPointId_local;
  
  local_30 = breakPointId;
  std::mutex::lock(&this->lockDebugger);
  if (this->paused == false) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[1] = puVar1 + 3;
    *(undefined1 *)(puVar1 + 3) = 0;
    *puVar1 = &PTR__NativeException_0023db08;
    __cxa_throw(puVar1,&debugger::IllegalRuntimeStateException::typeinfo,
                NativeException::~NativeException);
  }
  __it = std::
         _Hashtable<chatra::debugger::BreakPointId,_std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>,_std::__detail::_Select1st,_std::equal_to<chatra::debugger::BreakPointId>,_std::hash<chatra::debugger::BreakPointId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->breakPoints)._M_h,&local_30);
  if (__it.
      super__Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
      ._M_cur != (__node_type *)0x0) {
    cancelBreakPoint(this,(BreakPoint *)
                          ((long)__it.
                                 super__Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
                                 ._M_cur + 0x10));
    std::
    _Hashtable<chatra::debugger::BreakPointId,_std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>,_std::__detail::_Select1st,_std::equal_to<chatra::debugger::BreakPointId>,_std::hash<chatra::debugger::BreakPointId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->breakPoints)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
            ._M_cur);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lockDebugger);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = puVar1 + 3;
  *(undefined1 *)(puVar1 + 3) = 0;
  *puVar1 = &PTR__NativeException_0023ce78;
  __cxa_throw(puVar1,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

void RuntimeImp::removeBreakPoint(debugger::BreakPointId breakPointId) {
	CHATRA_CHECK_RUNTIME_PAUSED;

	auto it = breakPoints.find(breakPointId);
	if (it == breakPoints.cend())
		throw IllegalArgumentException();

	cancelBreakPoint(it->second);
	breakPoints.erase(it);
}